

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O2

void deqp::gles3::Functional::anon_unknown_0::verifyCurrentVertexAttribConversion
               (TestContext *testCtx,CallLogWrapper *gl,GLint index,GLfloat x,GLfloat y,GLfloat z,
               GLfloat w)

{
  ostringstream *this;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  StateQueryMemoryWriteGuard<int[4]> attribValue;
  undefined1 local_1b0 [384];
  
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
            (&attribValue);
  glu::CallLogWrapper::glGetVertexAttribiv(gl,index,0x8626,attribValue.m_value);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
            (&attribValue,testCtx);
  fVar1 = floorf(x);
  fVar2 = floorf(y);
  fVar3 = floorf(z);
  fVar4 = floorf(w);
  fVar5 = ceilf(x);
  fVar6 = ceilf(y);
  fVar7 = ceilf(z);
  fVar8 = ceilf(w);
  if (((((int)fVar5 < attribValue.m_value[0] || attribValue.m_value[0] < (int)fVar1) ||
       ((int)fVar6 < attribValue.m_value[1] || attribValue.m_value[1] < (int)fVar2)) ||
      ((int)fVar7 < attribValue.m_value[2] || attribValue.m_value[2] < (int)fVar3)) ||
     ((int)fVar8 < attribValue.m_value[3] || attribValue.m_value[3] < (int)fVar4)) {
    local_1b0._0_8_ = testCtx->m_log;
    this = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"// ERROR: expected in range ");
    std::operator<<((ostream *)this,"[");
    std::ostream::operator<<(this,(int)fVar1);
    std::operator<<((ostream *)this," ");
    std::ostream::operator<<(this,(int)fVar5);
    std::operator<<((ostream *)this,"], ");
    std::operator<<((ostream *)this,"[");
    std::ostream::operator<<(this,(int)fVar2);
    std::operator<<((ostream *)this," ");
    std::ostream::operator<<(this,(int)fVar6);
    std::operator<<((ostream *)this,"], ");
    std::operator<<((ostream *)this,"[");
    std::ostream::operator<<(this,(int)fVar3);
    std::operator<<((ostream *)this," ");
    std::ostream::operator<<(this,(int)fVar7);
    std::operator<<((ostream *)this,"], ");
    std::operator<<((ostream *)this,"[");
    std::ostream::operator<<(this,(int)fVar4);
    std::operator<<((ostream *)this," ");
    std::ostream::operator<<(this,(int)fVar8);
    std::operator<<((ostream *)this,"]");
    std::operator<<((ostream *)this,"; got ");
    std::ostream::operator<<(this,attribValue.m_value[0]);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,attribValue.m_value[1]);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,attribValue.m_value[2]);
    std::operator<<((ostream *)this,", ");
    std::ostream::operator<<(this,attribValue.m_value[3]);
    std::operator<<((ostream *)this," ");
    std::operator<<((ostream *)this,"; Input=");
    std::ostream::operator<<(this,x);
    std::operator<<((ostream *)this,"; ");
    std::ostream::operator<<(this,y);
    std::operator<<((ostream *)this,"; ");
    std::ostream::operator<<(this,z);
    std::operator<<((ostream *)this,"; ");
    std::ostream::operator<<(this,w);
    std::operator<<((ostream *)this," ");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid attribute value");
    }
  }
  return;
}

Assistant:

void verifyCurrentVertexAttribConversion (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLint index, GLfloat x, GLfloat y, GLfloat z, GLfloat w)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[4]> attribValue;
	gl.glGetVertexAttribiv(index, GL_CURRENT_VERTEX_ATTRIB, attribValue);

	attribValue.verifyValidity(testCtx);

	const GLint referenceAsGLintMin[] =
	{
		roundGLfloatToNearestIntegerDown<GLint>(x),
		roundGLfloatToNearestIntegerDown<GLint>(y),
		roundGLfloatToNearestIntegerDown<GLint>(z),
		roundGLfloatToNearestIntegerDown<GLint>(w)
	};
	const GLint referenceAsGLintMax[] =
	{
		roundGLfloatToNearestIntegerUp<GLint>(x),
		roundGLfloatToNearestIntegerUp<GLint>(y),
		roundGLfloatToNearestIntegerUp<GLint>(z),
		roundGLfloatToNearestIntegerUp<GLint>(w)
	};

	if (attribValue[0] < referenceAsGLintMin[0] || attribValue[0] > referenceAsGLintMax[0] ||
		attribValue[1] < referenceAsGLintMin[1] || attribValue[1] > referenceAsGLintMax[1] ||
		attribValue[2] < referenceAsGLintMin[2] || attribValue[2] > referenceAsGLintMax[2] ||
		attribValue[3] < referenceAsGLintMin[3] || attribValue[3] > referenceAsGLintMax[3])
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: expected in range "
			<< "[" << referenceAsGLintMin[0] << " " << referenceAsGLintMax[0] << "], "
			<< "[" << referenceAsGLintMin[1] << " " << referenceAsGLintMax[1] << "], "
			<< "[" << referenceAsGLintMin[2] << " " << referenceAsGLintMax[2] << "], "
			<< "[" << referenceAsGLintMin[3] << " " << referenceAsGLintMax[3] << "]"
			<< "; got "
			<< attribValue[0] << ", "
			<< attribValue[1] << ", "
			<< attribValue[2] << ", "
			<< attribValue[3] << " "
			<< "; Input="
			<< x << "; "
			<< y << "; "
			<< z << "; "
			<< w << " " << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid attribute value");
	}
}